

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_hash_map.h
# Opt level: O0

void __thiscall
crnlib::
hash_map<unsigned_int,_crnlib::empty_type,_crnlib::hasher<unsigned_int>,_crnlib::equal_to<unsigned_int>_>
::reset(hash_map<unsigned_int,_crnlib::empty_type,_crnlib::hasher<unsigned_int>,_crnlib::equal_to<unsigned_int>_>
        *this)

{
  uint uVar1;
  raw_node *__s;
  hash_map<unsigned_int,_crnlib::empty_type,_crnlib::hasher<unsigned_int>,_crnlib::equal_to<unsigned_int>_>
  *this_local;
  
  if (this->m_num_valid != 0) {
    __s = vector<crnlib::hash_map<unsigned_int,_crnlib::empty_type,_crnlib::hasher<unsigned_int>,_crnlib::equal_to<unsigned_int>_>::raw_node>
          ::operator[](&this->m_values,0);
    uVar1 = vector<crnlib::hash_map<unsigned_int,_crnlib::empty_type,_crnlib::hasher<unsigned_int>,_crnlib::equal_to<unsigned_int>_>::raw_node>
            ::size_in_bytes(&this->m_values);
    memset(__s,0,(ulong)uVar1);
    this->m_num_valid = 0;
  }
  return;
}

Assistant:

inline void reset()
        {
            if (!m_num_valid)
            {
                return;
            }

            if (CRNLIB_HAS_DESTRUCTOR(Key) || CRNLIB_HAS_DESTRUCTOR(Value))
            {
                node* p = &get_node(0);
                node* p_end = p + m_values.size();

                uint num_remaining = m_num_valid;
                while (p != p_end)
                {
                    if (p->state)
                    {
                        destruct_value_type(p);
                        p->state = cStateInvalid;

                        num_remaining--;
                        if (!num_remaining)
                        {
                            break;
                        }
                    }

                    p++;
                }
            }
            else if (sizeof(node) <= 32)
            {
                memset(&m_values[0], 0, m_values.size_in_bytes());
            }
            else
            {
                node* p = &get_node(0);
                node* p_end = p + m_values.size();

                uint num_remaining = m_num_valid;
                while (p != p_end)
                {
                    if (p->state)
                    {
                        p->state = cStateInvalid;

                        num_remaining--;
                        if (!num_remaining)
                        {
                            break;
                        }
                    }

                    p++;
                }
            }

            m_num_valid = 0;
        }